

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

Script * cfd::core::ScriptUtil::CreateP2pkLockingScript
                   (Script *__return_storage_ptr__,Pubkey *pubkey)

{
  undefined1 local_38 [8];
  ScriptBuilder builder;
  Pubkey *pubkey_local;
  
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pubkey;
  ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x401158);
  ScriptBuilder::AppendData
            ((ScriptBuilder *)local_38,
             (Pubkey *)
             builder.script_byte_array_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  ScriptBuilder::AppendOperator
            ((ScriptBuilder *)local_38,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
  ScriptBuilder::Build(__return_storage_ptr__,(ScriptBuilder *)local_38);
  ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x401191);
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2pkLockingScript(const Pubkey& pubkey) {
  // script作成
  ScriptBuilder builder;
  builder.AppendData(pubkey);
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);

  return builder.Build();
}